

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgzip.c
# Opt level: O1

FT_Error ft_gzip_file_fill_output(FT_GZipFile zip)

{
  FT_Byte *__dest;
  FT_Stream pFVar1;
  Bytef *pBVar2;
  bool bVar3;
  int iVar4;
  FT_Error FVar5;
  unsigned_long __n;
  FT_Error FVar6;
  z_stream *zstream;
  
  zip->cursor = zip->buffer;
  (zip->zstream).next_out = zip->buffer;
  (zip->zstream).avail_out = 0x1000;
  __dest = zip->input;
  FVar5 = 0;
  do {
    if ((zip->zstream).avail_out == 0) {
      return FVar5;
    }
    FVar6 = FVar5;
    if ((zip->zstream).avail_in == 0) {
      pFVar1 = zip->source;
      if (pFVar1->read == (FT_Stream_IoFunc)0x0) {
        __n = pFVar1->size - pFVar1->pos;
        if (__n != 0) {
          if (0xfff < __n) {
            __n = 0x1000;
          }
          memcpy(__dest,pFVar1->base + pFVar1->pos,__n);
          goto LAB_002735ae;
        }
LAB_0027357c:
        zip->limit = zip->cursor;
        FVar5 = 0x55;
        bVar3 = false;
      }
      else {
        __n = (*pFVar1->read)(pFVar1,pFVar1->pos,__dest,0x1000);
        if (__n == 0) goto LAB_0027357c;
LAB_002735ae:
        pFVar1->pos = pFVar1->pos + __n;
        (zip->zstream).next_in = __dest;
        (zip->zstream).avail_in = (uInt)__n;
        FVar5 = 0;
        bVar3 = true;
      }
      FVar6 = 0;
      if (bVar3) goto LAB_002735c6;
    }
    else {
LAB_002735c6:
      FVar5 = FVar6;
      iVar4 = inflate(&zip->zstream,0);
      if (iVar4 == 0) {
        FVar6 = 1;
      }
      else {
        if (iVar4 == 1) {
          pBVar2 = (zip->zstream).next_out;
          zip->limit = pBVar2;
          if (pBVar2 == zip->cursor) {
            FVar5 = 0x55;
          }
        }
        else {
          zip->limit = zip->cursor;
          FVar5 = 0x55;
        }
        FVar6 = 0;
      }
    }
    if ((char)FVar6 == '\0') {
      return FVar5;
    }
  } while( true );
}

Assistant:

static FT_Error
  ft_gzip_file_fill_output( FT_GZipFile  zip )
  {
    z_stream*  zstream = &zip->zstream;
    FT_Error   error   = FT_Err_Ok;


    zip->cursor        = zip->buffer;
    zstream->next_out  = zip->cursor;
    zstream->avail_out = FT_GZIP_BUFFER_SIZE;

    while ( zstream->avail_out > 0 )
    {
      int  err;


      if ( zstream->avail_in == 0 )
      {
        error = ft_gzip_file_fill_input( zip );
        if ( error )
          break;
      }

      err = inflate( zstream, Z_NO_FLUSH );

      if ( err == Z_STREAM_END )
      {
        zip->limit = zstream->next_out;
        if ( zip->limit == zip->cursor )
          error = FT_THROW( Invalid_Stream_Operation );
        break;
      }
      else if ( err != Z_OK )
      {
        zip->limit = zip->cursor;
        error      = FT_THROW( Invalid_Stream_Operation );
        break;
      }
    }

    return error;
  }